

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O0

DescriptorFlags __thiscall
Js::TypedArrayBase::GetItemSetter
          (TypedArrayBase *this,uint32 index,Var *setterValue,ScriptContext *requestContext)

{
  uint32 uVar1;
  ScriptContext *requestContext_local;
  Var *setterValue_local;
  uint32 index_local;
  TypedArrayBase *this_local;
  
  JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(this);
  uVar1 = ArrayObject::GetLength((ArrayObject *)this);
  if (index < uVar1) {
    this_local._4_4_ =
         DynamicObject::GetItemSetter((DynamicObject *)this,index,setterValue,requestContext);
  }
  else {
    this_local._4_4_ = None_NoProto;
  }
  return this_local._4_4_;
}

Assistant:

DescriptorFlags TypedArrayBase::GetItemSetter(uint32 index, Var* setterValue, ScriptContext* requestContext)
    {
#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(this);
#endif
        if (index >= this->GetLength())
        {
            return None_NoProto;
        }

        return __super::GetItemSetter(index, setterValue, requestContext);
    }